

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

int readParameters(char *inputFile,double *init,lattice *grid,fluidSim *sim,bndCond *bCond,
                  double *delt,double *t_end)

{
  int iVar1;
  __ssize_t _Var2;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  char *in_RDI;
  byte *in_R8;
  double *in_R9;
  size_t len;
  char *variable;
  int readVars;
  double ylength;
  double xlength;
  double value;
  FILE *input;
  size_t local_70;
  char *local_68;
  int local_5c;
  double local_58;
  double local_50;
  double local_48;
  FILE *local_40;
  double *local_38;
  byte *local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  char *local_10;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = fopen(in_RDI,"r");
  if (local_40 == (FILE *)0x0) {
    printf("The file \"%s\" probably doesn\'t exist. Please check your input!\n",local_10);
    return 0;
  }
  local_50 = 0.0;
  local_58 = 0.0;
  local_5c = 0;
  local_68 = (char *)0x0;
  local_70 = 0;
LAB_0011fb14:
  do {
    while( true ) {
      do {
        _Var2 = getline(&local_68,&local_70,local_40);
        if (_Var2 < 1) {
          fclose(local_40);
          free(local_68);
          *local_20 = local_50 / (double)*(int *)(local_20 + 2);
          local_20[1] = local_58 / (double)*(int *)((long)local_20 + 0x14);
          return local_5c;
        }
      } while (*local_68 == '#');
      iVar1 = __isoc99_sscanf(local_68,"%*s%*[ \t]%lg",&local_48);
      if (iVar1 == 1) break;
      printf("Malformed input: %s\n",local_68);
    }
    switch(*local_68) {
    case 'G':
      if (local_68[1] == 'X') {
        local_28[3] = local_48;
      }
      else {
        local_28[4] = local_48;
      }
      break;
    default:
      goto switchD_0011fb9f_caseD_48;
    case 'P':
      local_18[2] = local_48;
      break;
    case 'R':
      *local_28 = local_48;
      break;
    case 'U':
      *local_18 = local_48;
      break;
    case 'V':
      local_18[1] = local_48;
      break;
    case 'a':
      local_28[7] = local_48;
      break;
    case 'd':
      local_28[2] = local_48;
      *local_38 = local_48;
      break;
    case 'e':
      local_28[5] = local_48;
      break;
    case 'i':
      if (local_68[1] == 'm') {
        *(int *)(local_20 + 2) = (int)local_48;
      }
      else {
        *(int *)(local_28 + 8) = (int)local_48;
      }
      break;
    case 'j':
      *(int *)((long)local_20 + 0x14) = (int)local_48;
      break;
    case 'o':
      local_28[6] = local_48;
      break;
    case 't':
      if (local_68[1] == 'a') {
        local_28[1] = local_48;
      }
      else {
        *(double *)len = local_48;
      }
      break;
    case 'w':
      if (local_68[1] == 't') {
        *local_30 = *local_30 & 0xfc | (byte)(long)local_48 & 3;
      }
      else if (local_68[1] == 'b') {
        *local_30 = *local_30 & 0xcf | ((byte)(long)local_48 & 3) << 4;
      }
      else if (local_68[1] == 'r') {
        *local_30 = *local_30 & 0xf3 | ((byte)(long)local_48 & 3) << 2;
      }
      else if (local_68[1] == 'l') {
        *local_30 = *local_30 & 0x3f | (char)(long)local_48 << 6;
      }
      break;
    case 'x':
      local_50 = local_48;
      break;
    case 'y':
      local_58 = local_48;
    }
    local_5c = local_5c + 1;
  } while( true );
switchD_0011fb9f_caseD_48:
  printf("Found unexpected Variable %s of value %lg.\n",local_48,local_68);
  goto LAB_0011fb14;
}

Assistant:

int readParameters (const char *inputFile, REAL *init,
		lattice *grid, fluidSim *sim, bndCond *bCond,
		REAL *delt, REAL *t_end)
{
	FILE *input = fopen(inputFile,"r");
	if (input == NULL)
	{
		printf("The file \"%s\" probably doesn't exist. Please check your input!\n",inputFile);
		return 0;
	}
	REAL value;
	REAL xlength = 0, ylength = 0;
	int readVars = 0;

	char *variable = NULL;
	size_t len = 0;

	while (getline(&variable, &len, input) > 0)
	{
		if (variable[0] == '#')
			continue;
		if (sscanf(variable, "%*s%*[ \t]%lg", &value) != 1)
		{
			printf("Malformed input: %s\n",variable);
			continue;
		}
		switch(variable[0])
		{
			case 'x':
				xlength = value;
				break;
			case 'y':
				ylength = value;
				break;
			case 'i':
				if (variable[1] == 'm') grid->imax = (int)value;
				else sim->itmax = (int)value;
				break;
			case 'j':
				grid->jmax = (int)value;
				break;
			case 'e':
				sim->eps = value;
				break;
			case 'o':
				sim->omega = value;
				break;
			case 'a':
				sim->alpha = value;
				break;
			case 'd':
				*delt = sim->dt = value;
				break;
			case 't':
				if (variable[1] == 'a') sim->tau = value;
				else *t_end = value;
				break;
			case 'R':
				sim->Re = value;
				break;
			case 'U':
				init[0] = value;
				break;
			case 'V':
				init[1] = value;
				break;
			case 'P':
				init[2] = value;
				break;
			case 'G':
				if (variable[1] == 'X') sim->GX = value;
				else sim->GY = value;
				break;
			case 'w':
				if (variable[1] == 't') bCond->wt = (unsigned)value;
				else if (variable[1] == 'b') bCond->wb = (unsigned)value;
				else if (variable[1] == 'r') bCond->wr = (unsigned)value;
				else if (variable[1] == 'l') bCond->wl = (unsigned)value;
				break;
			default:
				printf("Found unexpected Variable %s of value %lg.\n",variable,value);
				continue;
		}
		readVars++;
	}
	fclose(input);
	free(variable);
	grid->delx = xlength/grid->imax;
	grid->dely = ylength/grid->jmax;
	return readVars;
}